

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool __thiscall ON_Mesh::InsertNgon(ON_Mesh *this,uint ngon_index,ON_MeshNgon *ngon)

{
  uint uVar1;
  uint uVar2;
  ON_MeshNgon *local_38;
  byte local_29;
  ON_MeshNgon *pOStack_28;
  bool bUpdateNgonMap;
  ON_MeshNgon *ngon_local;
  ON_Mesh *pOStack_18;
  uint ngon_index_local;
  ON_Mesh *this_local;
  
  if (ngon_index == 0xffffffff) {
    this_local._7_1_ = false;
  }
  else {
    pOStack_28 = ngon;
    ngon_local._4_4_ = ngon_index;
    pOStack_18 = this;
    uVar1 = ON_SimpleArray<ON_MeshNgon_*>::UnsignedCount(&this->m_Ngon);
    if (ngon_index < uVar1) {
      uVar1 = ON_SimpleArray<unsigned_int>::UnsignedCount(&this->m_NgonMap);
      uVar2 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_F);
      local_29 = uVar1 == uVar2;
      local_38 = (ON_MeshNgon *)0x0;
      ON_SimpleArray<ON_MeshNgon_*>::Insert(&this->m_Ngon,ngon_local._4_4_,&local_38);
      if ((local_29 & 1) != 0) {
        CreateNgonMap(this);
      }
    }
    else {
      SetNgonCount(this,ngon_local._4_4_ + 1);
    }
    this_local._7_1_ = ModifyNgon(this,ngon_local._4_4_,pOStack_28);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Mesh::InsertNgon(
  unsigned int ngon_index,
  const ON_MeshNgon* ngon
  )
{
  if ( ngon_index >= ON_UNSET_UINT_INDEX )
    return false;

  if ( ngon_index >= m_Ngon.UnsignedCount() )
  {
    SetNgonCount(ngon_index+1);
  }
  else
  {
    bool bUpdateNgonMap = (m_NgonMap.UnsignedCount() == m_F.UnsignedCount());
    m_Ngon.Insert(ngon_index,0);
    if (bUpdateNgonMap)
      CreateNgonMap();
  }
  return ModifyNgon(ngon_index,ngon);
}